

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TreePushOverrideID(ImGuiID id)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiID id_local;
  
  pIVar1 = GImGui->CurrentWindow;
  g._4_4_ = id;
  Indent(0.0);
  (pIVar1->DC).TreeDepth = (pIVar1->DC).TreeDepth + 1;
  ImVector<unsigned_int>::push_back(&pIVar1->IDStack,(uint *)((long)&g + 4));
  return;
}

Assistant:

void ImGui::TreePushOverrideID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    Indent();
    window->DC.TreeDepth++;
    window->IDStack.push_back(id);
}